

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_fwd.hpp
# Opt level: O2

void __thiscall
toml::detail::
value_with_format<toml::detail::storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>_>,_toml::table_format_info>
::value_with_format(value_with_format<toml::detail::storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>_>,_toml::table_format_info>
                    *this,value_with_format<toml::detail::storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>_>,_toml::table_format_info>
                          *param_1)

{
  indent_char iVar1;
  undefined2 uVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  
  storage<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::type_config>_>_>_>_>
  ::storage(&this->value,&param_1->value);
  iVar1 = (param_1->format).indent_type;
  uVar2 = *(undefined2 *)&(param_1->format).field_0x2;
  iVar3 = (param_1->format).body_indent;
  iVar4 = (param_1->format).name_indent;
  iVar5 = (param_1->format).closing_indent;
  (this->format).fmt = (param_1->format).fmt;
  (this->format).indent_type = iVar1;
  *(undefined2 *)&(this->format).field_0x2 = uVar2;
  (this->format).body_indent = iVar3;
  (this->format).name_indent = iVar4;
  (this->format).closing_indent = iVar5;
  return;
}

Assistant:

value_with_format(const value_with_format&) = default;